

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.c
# Opt level: O0

image_data * tga_read(sptr_t data)

{
  tga_header *out;
  image_data *im_00;
  sptr_t sVar1;
  sptr_t colors;
  uchar *local_e8;
  size_t local_e0;
  uchar *local_c8;
  undefined7 uStack_a7;
  undefined7 uStack_8f;
  uchar *local_88;
  size_t local_80;
  uchar *local_78;
  uint7 uStack_57;
  image_data *im;
  size_t cm_size;
  sptr_t palette;
  sptr_t content;
  tga_header *header;
  sptr_t data_local;
  
  out = (tga_header *)xmalloc(0x14);
  sVar1 = tga_read_header(data,out);
  im = (image_data *)0x0;
  im_00 = (image_data *)xmalloc(0x50);
  if (out->color_map_type != '\0') {
    im = (image_data *)(long)(int)(((uint)out->cm_entry_count * (uint)out->cm_entry_size) / 8);
  }
  im_00->header = out;
  im_00->type = '\x03';
  im_00->width = (uint)out->im_width;
  im_00->height = (uint)out->im_height;
  (im_00->palette).data.ptr = (uchar *)0x0;
  (im_00->palette).data.size = 0;
  *(ulong *)&(im_00->palette).type = (ulong)uStack_57 << 8;
  sVar1 = sptr_advance(sVar1,(ulong)out->id_length);
  local_78 = sVar1.ptr;
  if (out->color_map_type != '\0') {
    colors = sptr_xmalloc((size_t)im);
    local_88 = colors.ptr;
    local_80 = colors.size;
    memcpy(local_88,local_78,(size_t)im);
    if ((out->cm_entry_size == '\x18') && (im == (image_data *)0x300)) {
      flip_bgr(colors);
      (im_00->palette).data.ptr = local_88;
      (im_00->palette).data.size = local_80;
      *(ulong *)&(im_00->palette).type = CONCAT71(uStack_8f,1);
    }
    else {
      (im_00->palette).data.ptr = local_88;
      (im_00->palette).data.size = local_80;
      *(ulong *)&(im_00->palette).type = CONCAT71(uStack_a7,0xff);
    }
  }
  sVar1 = sptr_advance(sVar1,(size_t)im);
  local_c8 = sVar1.ptr;
  (im_00->pixels).ptr = (uchar *)0x0;
  (im_00->pixels).size = 0;
  if ((out->image_type == '\x01') && (out->im_pixel_depth == '\b')) {
    sVar1 = sptr_xmalloc((ulong)(im_00->width * im_00->height));
    local_e8 = sVar1.ptr;
    (im_00->pixels).ptr = local_e8;
    local_e0 = sVar1.size;
    (im_00->pixels).size = local_e0;
    memcpy((im_00->pixels).ptr,local_c8,(im_00->pixels).size);
  }
  else if ((out->image_type == '\t') && (out->im_pixel_depth == '\b')) {
    tga_read_rle_indexed(im_00,sVar1);
  }
  return im_00;
}

Assistant:

struct image_data *tga_read(const sptr_t data)
{
	struct tga_header *header = xmalloc(sizeof(struct tga_header));
	sptr_t content = tga_read_header(data, header);
	sptr_t palette;
	size_t cm_size = 0;
	struct image_data *im = xmalloc(sizeof(struct image_data));
	if (header->color_map_type > 0) {
		cm_size = (header->cm_entry_count * header->cm_entry_size) / 8;
	}
	im->header = header;
	im->type = IMAGE_TYPE_TGA;
	im->width = header->im_width;
	im->height = header->im_height;
	im->palette = (struct image_palette){SPTR_NULL, PALETTE_TYPE_NONE};
	// skip image ID
	content = sptr_advance(content, header->id_length);
	// color map
	if (header->color_map_type > 0) {
		palette = sptr_xmalloc(cm_size);
		memcpy(palette.ptr, content.ptr, cm_size);
		if (header->cm_entry_size == 24 && cm_size == 3 * 256) {
			flip_bgr(palette);
			im->palette = (struct image_palette){palette, PALETTE_TYPE_RGB_256};
		} else {
			im->palette = (struct image_palette){palette, PALETTE_TYPE_UNKNOWN};
		}
	}
	content = sptr_advance(content, cm_size);
	// pixels
	im->pixels = SPTR_NULL;
	if ((header->image_type == TGA_IMAGE_TYPE_UNCOMPRESSED_COLOR_MAPPED) &&
		(header->im_pixel_depth == 8)) {
		im->pixels = sptr_xmalloc(im->width * im->height);
		memcpy(im->pixels.ptr, content.ptr, im->pixels.size);
	} else if ((header->image_type == TGA_IMAGE_TYPE_RLE_COLOR_MAPPED) &&
			   (header->im_pixel_depth == 8)) {
		tga_read_rle_indexed(im, content);
	}
	return im;
}